

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_arena_lextents_print(emitter_t *emitter,uint i,uint64_t uptime)

{
  emitter_col_t *peVar1;
  int iVar2;
  emitter_output_t eVar3;
  int iVar4;
  tsd_t *tsd;
  tsd_t *ptVar5;
  undefined8 uVar6;
  ulong uVar7;
  emitter_col_t *peVar8;
  char *pcVar9;
  uint64_t uVar10;
  emitter_col_t *peVar11;
  size_t curlextents;
  uint64_t nrequests;
  size_t lextent_size;
  uint nlextents;
  uint64_t local_418;
  uint64_t uptime_s;
  size_t sz_5;
  uint64_t ndalloc;
  size_t miblen_new_2;
  uint nbins;
  emitter_col_t *local_3e8;
  uint64_t local_3e0;
  undefined8 local_3d8;
  size_t sz_6;
  size_t stats_arenas_mib [7];
  size_t arenas_lextent_mib [7];
  emitter_col_t header_curlextents;
  emitter_col_t col_curlextents;
  emitter_col_t header_nrequests_ps;
  emitter_col_t col_nrequests_ps;
  emitter_col_t header_nrequests;
  emitter_col_t col_nrequests;
  emitter_col_t header_ndalloc_ps;
  emitter_col_t col_ndalloc_ps;
  emitter_col_t local_210;
  emitter_col_t local_1e8;
  emitter_col_t local_1c0;
  emitter_col_t local_198;
  emitter_col_t local_170;
  emitter_col_t local_148;
  emitter_col_t local_120;
  emitter_col_t local_f8;
  emitter_col_t local_d0;
  emitter_col_t local_a8;
  emitter_col_t local_80;
  emitter_col_t local_58;
  
  stats_arenas_mib[0] = 4;
  iVar2 = duckdb_je_mallctl("arenas.nbins",&nbins,stats_arenas_mib,(void *)0x0,0);
  if (iVar2 == 0) {
    stats_arenas_mib[0] = 4;
    iVar2 = duckdb_je_mallctl("arenas.nlextents",&nlextents,stats_arenas_mib,(void *)0x0,0);
    if (iVar2 == 0) {
      local_120.justify = emitter_justify_right;
      local_120.width = 0x14;
      local_120.type = emitter_type_size;
      local_148.justify = emitter_justify_right;
      local_148.width = 0x14;
      local_148.type = emitter_type_title;
      local_148.field_3.str_val = "size";
      local_170.link.qre_prev = &local_120;
      local_120.link.qre_next = &local_170;
      local_170.justify = emitter_justify_right;
      local_170.width = 4;
      local_170.type = emitter_type_unsigned;
      local_58.link.qre_prev = &local_148;
      local_148.link.qre_next = &local_58;
      local_58.justify = emitter_justify_right;
      local_58.width = 4;
      local_58.type = emitter_type_title;
      local_58.field_3.str_val = "ind";
      local_198.link.qre_prev = &local_170;
      local_170.link.qre_next = &local_198;
      local_198.justify = emitter_justify_right;
      local_198.width = 0xd;
      local_198.type = emitter_type_size;
      local_80.link.qre_prev = &local_58;
      local_58.link.qre_next = &local_80;
      local_80.justify = emitter_justify_right;
      local_80.width = 0xd;
      local_80.type = emitter_type_title;
      local_80.field_3.str_val = "allocated";
      local_1c0.link.qre_prev = &local_198;
      local_198.link.qre_next = &local_1c0;
      local_1c0.justify = emitter_justify_right;
      local_1c0.width = 0xd;
      local_1c0.type = emitter_type_uint64;
      local_a8.link.qre_prev = &local_80;
      local_80.link.qre_next = &local_a8;
      local_a8.justify = emitter_justify_right;
      local_a8.width = 0xd;
      local_a8.type = emitter_type_title;
      local_a8.field_3.str_val = "nmalloc";
      local_1e8.link.qre_prev = &local_1c0;
      local_1c0.link.qre_next = &local_1e8;
      local_1e8.justify = emitter_justify_right;
      local_1e8.width = 8;
      local_1e8.type = emitter_type_uint64;
      local_d0.link.qre_prev = &local_a8;
      local_d0.link.qre_next = &local_148;
      local_a8.link.qre_next = &local_d0;
      local_d0.justify = emitter_justify_right;
      local_d0.width = 8;
      local_d0.type = emitter_type_title;
      local_d0.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x1f620de;
      local_120.link.qre_prev = &local_210;
      local_210.link.qre_prev = &local_1e8;
      local_210.link.qre_next = &local_120;
      local_1e8.link.qre_next = &local_210;
      local_210.justify = emitter_justify_right;
      local_210.width = 0xd;
      local_210.type = emitter_type_uint64;
      local_d0.link.qre_next = &local_f8;
      local_148.link.qre_prev = local_d0.link.qre_next;
      local_f8.link.qre_prev = &local_d0;
      local_f8.link.qre_next = &local_148;
      local_f8.justify = emitter_justify_right;
      local_f8.width = 0xd;
      local_f8.type = emitter_type_title;
      local_f8.field_3.str_val = "ndalloc";
      col_ndalloc_ps.link.qre_next = &col_ndalloc_ps;
      col_ndalloc_ps.link.qre_prev = &col_ndalloc_ps;
      if (&local_120 != (emitter_col_t *)0x0) {
        col_ndalloc_ps.link.qre_next = &local_210;
        col_ndalloc_ps.link.qre_prev = &local_210;
        local_120.link.qre_prev = &col_ndalloc_ps;
      }
      col_ndalloc_ps.link.qre_next = col_ndalloc_ps.link.qre_prev;
      col_ndalloc_ps.justify = emitter_justify_right;
      col_ndalloc_ps.width = 8;
      col_ndalloc_ps.type = emitter_type_uint64;
      header_ndalloc_ps.link.qre_next = &header_ndalloc_ps;
      header_ndalloc_ps.link.qre_prev = &header_ndalloc_ps;
      if (&local_148 != (emitter_col_t *)0x0) {
        header_ndalloc_ps.link.qre_next = local_d0.link.qre_next;
        header_ndalloc_ps.link.qre_prev = local_d0.link.qre_next;
        local_148.link.qre_prev = &header_ndalloc_ps;
      }
      header_ndalloc_ps.link.qre_next = header_ndalloc_ps.link.qre_prev;
      local_148.justify = emitter_justify_right;
      header_ndalloc_ps.justify = emitter_justify_right;
      header_ndalloc_ps.width = 8;
      header_ndalloc_ps.type = emitter_type_title;
      header_ndalloc_ps.field_3.str_val = "(#/sec)";
      col_nrequests.link.qre_next = &col_nrequests;
      col_nrequests.link.qre_prev = col_nrequests.link.qre_next;
      if (col_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        col_nrequests.link.qre_next = ((col_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((col_ndalloc_ps.link.qre_prev)->link).qre_prev = &col_nrequests;
        col_nrequests.link.qre_prev = col_nrequests.link.qre_next;
        ((((col_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_ndalloc_ps.link.qre_next;
        ((col_nrequests.link.qre_next)->link).qre_next = &col_nrequests;
      }
      col_nrequests.justify = emitter_justify_right;
      col_nrequests.width = 0xd;
      col_nrequests.type = emitter_type_uint64;
      header_nrequests.link.qre_next = &header_nrequests;
      header_nrequests.link.qre_prev = header_nrequests.link.qre_next;
      if (header_ndalloc_ps.link.qre_prev != (emitter_col_t *)0x0) {
        header_nrequests.link.qre_next = ((header_ndalloc_ps.link.qre_prev)->link).qre_prev;
        ((header_ndalloc_ps.link.qre_prev)->link).qre_prev = &header_nrequests;
        header_nrequests.link.qre_prev = header_nrequests.link.qre_next;
        ((((header_ndalloc_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_ndalloc_ps.link.qre_next;
        ((header_nrequests.link.qre_next)->link).qre_next = &header_nrequests;
      }
      header_nrequests.justify = emitter_justify_right;
      header_nrequests.width = 0xd;
      header_nrequests.type = emitter_type_title;
      header_nrequests.field_3.str_val = "nrequests";
      col_nrequests_ps.link.qre_next = &col_nrequests_ps;
      col_nrequests_ps.link.qre_prev = col_nrequests_ps.link.qre_next;
      col_nrequests.link.qre_prev = col_nrequests.link.qre_next;
      if (col_nrequests.link.qre_next != (emitter_col_t *)0x0) {
        col_nrequests_ps.link.qre_next = ((col_nrequests.link.qre_next)->link).qre_prev;
        ((col_nrequests.link.qre_next)->link).qre_prev = &col_nrequests_ps;
        col_nrequests_ps.link.qre_prev = col_nrequests_ps.link.qre_next;
        ((((col_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests.link.qre_next;
        ((col_nrequests_ps.link.qre_next)->link).qre_next = &col_nrequests_ps;
      }
      col_nrequests_ps.justify = emitter_justify_right;
      col_nrequests_ps.width = 8;
      col_nrequests_ps.type = emitter_type_uint64;
      header_nrequests_ps.link.qre_next = &header_nrequests_ps;
      header_nrequests_ps.link.qre_prev = header_nrequests_ps.link.qre_next;
      header_nrequests.link.qre_prev = header_nrequests.link.qre_next;
      if (header_nrequests.link.qre_next != (emitter_col_t *)0x0) {
        header_nrequests_ps.link.qre_next = ((header_nrequests.link.qre_next)->link).qre_prev;
        ((header_nrequests.link.qre_next)->link).qre_prev = &header_nrequests_ps;
        header_nrequests_ps.link.qre_prev = header_nrequests_ps.link.qre_next;
        ((((header_nrequests.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests.link.qre_next;
        ((header_nrequests_ps.link.qre_next)->link).qre_next = &header_nrequests_ps;
      }
      header_nrequests_ps.justify = emitter_justify_right;
      header_nrequests_ps.width = 8;
      header_nrequests_ps.type = emitter_type_title;
      header_nrequests_ps.field_3.str_val = "(#/sec)";
      peVar8 = &col_curlextents;
      col_curlextents.link.qre_next = peVar8;
      col_curlextents.link.qre_prev = peVar8;
      col_nrequests_ps.link.qre_prev = col_nrequests_ps.link.qre_next;
      if (col_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
        peVar8 = ((col_nrequests_ps.link.qre_next)->link).qre_prev;
        col_curlextents.link.qre_next = peVar8;
        ((col_nrequests_ps.link.qre_next)->link).qre_prev = &col_curlextents;
        col_curlextents.link.qre_prev = peVar8;
        ((((col_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             col_nrequests_ps.link.qre_next;
        (peVar8->link).qre_next = &col_curlextents;
      }
      col_curlextents.justify = emitter_justify_right;
      col_curlextents.width = 0xd;
      col_curlextents.type = emitter_type_size;
      peVar11 = &header_curlextents;
      header_curlextents.link.qre_next = peVar11;
      header_curlextents.link.qre_prev = peVar11;
      header_nrequests_ps.link.qre_prev = header_nrequests_ps.link.qre_next;
      if (header_nrequests_ps.link.qre_next != (emitter_col_t *)0x0) {
        peVar11 = ((header_nrequests_ps.link.qre_next)->link).qre_prev;
        header_curlextents.link.qre_next = peVar11;
        ((header_nrequests_ps.link.qre_next)->link).qre_prev = &header_curlextents;
        header_curlextents.link.qre_prev = peVar11;
        ((((header_nrequests_ps.link.qre_next)->link).qre_prev)->link).qre_next =
             header_nrequests_ps.link.qre_next;
        (peVar11->link).qre_next = &header_curlextents;
      }
      header_curlextents.justify = emitter_justify_right;
      header_curlextents.width = 0xd;
      header_curlextents.type = emitter_type_title;
      header_curlextents.field_3.str_val = "curlextents";
      local_148.width = 0xe;
      header_curlextents.link.qre_next = peVar11;
      header_curlextents.link.qre_prev = peVar11;
      col_curlextents.link.qre_next = peVar8;
      col_curlextents.link.qre_prev = peVar8;
      emitter_table_printf(emitter,"large:");
      local_418 = uptime;
      peVar1 = peVar11;
      if (emitter->output == emitter_output_table) {
        do {
          if (peVar1 == (emitter_col_t *)0x0) break;
          emitter_print_value(emitter,peVar1->justify,peVar1->width,peVar1->type,&peVar1->field_3);
          peVar1 = (peVar1->link).qre_next;
        } while (peVar1 != peVar11);
        emitter_table_printf(emitter,anon_var_dwarf_4f1835b + 8);
      }
      uVar10 = local_418;
      emitter_json_array_kv_begin(emitter,"lextents");
      arenas_lextent_mib[0] = 7;
      tsd = (tsd_t *)__tls_get_addr(&PTR_0249eae0);
      ptVar5 = tsd;
      if ((tsd->state).repr != '\0') {
        ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      iVar2 = duckdb_je_ctl_mibnametomib
                        (ptVar5,stats_arenas_mib,0,"stats.arenas",arenas_lextent_mib);
      if (iVar2 == 0) {
        arenas_lextent_mib[0] = 7;
        ptVar5 = tsd;
        stats_arenas_mib[2] = (ulong)i;
        if ((tsd->state).repr != '\0') {
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar2 = duckdb_je_ctl_mibnametomib(ptVar5,stats_arenas_mib,3,"lextents",arenas_lextent_mib);
        if (iVar2 == 0) {
          miblen_new_2 = 7;
          ptVar5 = tsd;
          if ((tsd->state).repr != '\0') {
            ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
          }
          iVar2 = duckdb_je_ctl_mibnametomib
                            (ptVar5,arenas_lextent_mib,0,"arenas.lextent",&miblen_new_2);
          if (iVar2 == 0) {
            if (nlextents == 0) {
              uVar6 = 0;
            }
            else {
              uptime_s = uVar10 / 1000000000;
              uVar7 = 0;
              uVar6 = 0;
              local_3e8 = peVar8;
              do {
                ndalloc = 7;
                nrequests = 8;
                ptVar5 = tsd;
                stats_arenas_mib[4] = uVar7;
                arenas_lextent_mib[2] = uVar7;
                if ((tsd->state).repr != '\0') {
                  ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar5,stats_arenas_mib,5,"nmalloc",&ndalloc,&miblen_new_2,
                                   &nrequests,(void *)0x0,0);
                if (iVar2 != 0) {
LAB_00cf2903:
                  pcVar9 = "<jemalloc>: Failure in ctl_bymibname()\n";
                  goto LAB_00cf290a;
                }
                nrequests = 7;
                lextent_size = 8;
                ptVar5 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar5,stats_arenas_mib,5,"ndalloc",&nrequests,&ndalloc,
                                   &lextent_size,(void *)0x0,0);
                if (iVar2 != 0) goto LAB_00cf2903;
                lextent_size = 7;
                curlextents = 8;
                ptVar5 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar5,stats_arenas_mib,5,"nrequests",&lextent_size,&nrequests,
                                   &curlextents,(void *)0x0,0);
                if (iVar2 != 0) goto LAB_00cf2903;
                local_3e0 = nrequests;
                local_3d8 = CONCAT71((int7)(nrequests >> 8),nrequests == 0);
                if ((~(byte)uVar6 & 1) == 0 && nrequests != 0) {
                  emitter_table_printf(emitter,"                     ---\n");
                }
                curlextents = 7;
                sz_5 = 8;
                ptVar5 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar5,arenas_lextent_mib,3,"size",&curlextents,&lextent_size,
                                   &sz_5,(void *)0x0,0);
                if (iVar2 != 0) goto LAB_00cf2903;
                sz_5 = 7;
                sz_6 = 8;
                ptVar5 = tsd;
                if ((tsd->state).repr != '\0') {
                  ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
                }
                iVar2 = duckdb_je_ctl_bymibname
                                  (ptVar5,stats_arenas_mib,5,"curlextents",&sz_5,&curlextents,&sz_6,
                                   (void *)0x0,0);
                if (iVar2 != 0) goto LAB_00cf2903;
                eVar3 = emitter->output;
                if (eVar3 < emitter_output_table) {
                  if (emitter->emitted_key == true) {
                    emitter->emitted_key = false;
                  }
                  else {
                    if (emitter->item_at_depth == true) {
                      emitter_printf(emitter,",");
                      eVar3 = emitter->output;
                    }
                    if (eVar3 != emitter_output_json_compact) {
                      emitter_printf(emitter,anon_var_dwarf_4f1835b + 8);
                      pcVar9 = anon_var_dwarf_4f18730 + 7;
                      if (emitter->output != emitter_output_json) {
                        pcVar9 = " ";
                      }
                      if (0 < emitter->nesting_depth) {
                        iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                        if (iVar2 < 2) {
                          iVar2 = 1;
                        }
                        do {
                          emitter_printf(emitter,"%s",pcVar9);
                          iVar2 = iVar2 + -1;
                        } while (iVar2 != 0);
                      }
                    }
                  }
                  emitter_printf(emitter,"{");
                  emitter->nesting_depth = emitter->nesting_depth + 1;
                  emitter->item_at_depth = false;
                  peVar8 = local_3e8;
                  uVar10 = local_418;
                }
                emitter_json_kv(emitter,"curlextents",emitter_type_size,&curlextents);
                if (emitter->output < emitter_output_table) {
                  emitter->nesting_depth = emitter->nesting_depth + -1;
                  emitter->item_at_depth = true;
                  if (emitter->output != emitter_output_json_compact) {
                    emitter_printf(emitter,anon_var_dwarf_4f1835b + 8);
                    pcVar9 = anon_var_dwarf_4f18730 + 7;
                    if (emitter->output != emitter_output_json) {
                      pcVar9 = " ";
                    }
                    if (0 < emitter->nesting_depth) {
                      iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                      if (iVar2 < 2) {
                        iVar2 = 1;
                      }
                      do {
                        emitter_printf(emitter,"%s",pcVar9);
                        iVar2 = iVar2 + -1;
                      } while (iVar2 != 0);
                    }
                  }
                  emitter_printf(emitter,"}");
                  peVar8 = local_3e8;
                  uVar10 = local_418;
                }
                local_120.field_3.size_val = lextent_size;
                local_170.field_3.int_val = nbins + (int)uVar7;
                local_198.field_3.uint64_val = curlextents * lextent_size;
                local_1c0.field_3.size_val = miblen_new_2;
                local_1e8.field_3.size_val = miblen_new_2;
                if (uVar10 == 0) {
                  local_1e8.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                }
                if (miblen_new_2 != 0 && 999999999 < uVar10) {
                  local_1e8.field_3.uint64_val = miblen_new_2 / uptime_s;
                }
                local_210.field_3.uint64_val = ndalloc;
                col_ndalloc_ps.field_3.uint64_val = ndalloc;
                if (uVar10 == 0) {
                  col_ndalloc_ps.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                }
                if (ndalloc != 0 && 999999999 < uVar10) {
                  col_ndalloc_ps.field_3.uint64_val = ndalloc / uptime_s;
                }
                col_nrequests.field_3.uint64_val = nrequests;
                col_nrequests_ps.field_3.uint64_val = nrequests;
                if (uVar10 == 0) {
                  col_nrequests_ps.field_3 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)0x0;
                }
                if (nrequests != 0 && 999999999 < uVar10) {
                  col_nrequests_ps.field_3.uint64_val = nrequests / uptime_s;
                }
                col_curlextents.field_3.size_val = curlextents;
                if ((local_3e0 != 0) && (peVar11 = peVar8, emitter->output == emitter_output_table))
                {
                  do {
                    if (peVar11 == (emitter_col_t *)0x0) break;
                    emitter_print_value(emitter,peVar11->justify,peVar11->width,peVar11->type,
                                        &peVar11->field_3);
                    peVar11 = (peVar11->link).qre_next;
                  } while (peVar11 != peVar8);
                  emitter_table_printf(emitter,anon_var_dwarf_4f1835b + 8);
                  uVar10 = local_418;
                }
                uVar7 = uVar7 + 1;
                uVar6 = local_3d8;
              } while (uVar7 < nlextents);
            }
            if (emitter->output < emitter_output_table) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              if (emitter->output != emitter_output_json_compact) {
                emitter_printf(emitter,anon_var_dwarf_4f1835b + 8);
                pcVar9 = anon_var_dwarf_4f18730 + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar9 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar2 = 1;
                  if (1 < iVar4) {
                    iVar2 = iVar4;
                  }
                  do {
                    emitter_printf(emitter,"%s",pcVar9);
                    iVar2 = iVar2 + -1;
                  } while (iVar2 != 0);
                }
              }
              emitter_printf(emitter,"]");
            }
            if ((char)uVar6 != '\0') {
              emitter_table_printf(emitter,"                     ---\n");
            }
            return;
          }
        }
      }
      pcVar9 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
LAB_00cf290a:
      duckdb_je_malloc_write(pcVar9);
      abort();
    }
    pcVar9 = "arenas.nlextents";
  }
  else {
    pcVar9 = "arenas.nbins";
  }
  duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar9);
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_lextents_print(emitter_t *emitter, unsigned i, uint64_t uptime) {
	unsigned nbins, nlextents, j;
	bool in_gap, in_gap_prev;

	CTL_GET("arenas.nbins", &nbins, unsigned);
	CTL_GET("arenas.nlextents", &nlextents, unsigned);

	emitter_row_t header_row;
	emitter_row_init(&header_row);
	emitter_row_t row;
	emitter_row_init(&row);

	bool prof_stats_on = config_prof && opt_prof && opt_prof_stats
	    && i == MALLCTL_ARENAS_ALL;

	COL_HDR(row, size, NULL, right, 20, size)
	COL_HDR(row, ind, NULL, right, 4, unsigned)
	COL_HDR(row, allocated, NULL, right, 13, size)
	COL_HDR(row, nmalloc, NULL, right, 13, uint64)
	COL_HDR(row, nmalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, ndalloc, NULL, right, 13, uint64)
	COL_HDR(row, ndalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nrequests, NULL, right, 13, uint64)
	COL_HDR(row, nrequests_ps, "(#/sec)", right, 8, uint64)
	COL_HDR_DECLARE(prof_live_requested)
	COL_HDR_DECLARE(prof_live_count)
	COL_HDR_DECLARE(prof_accum_requested)
	COL_HDR_DECLARE(prof_accum_count)
	if (prof_stats_on) {
		COL_HDR_INIT(row, prof_live_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_live_count, NULL, right, 17, uint64)
		COL_HDR_INIT(row, prof_accum_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_accum_count, NULL, right, 17, uint64)
	}
	COL_HDR(row, curlextents, NULL, right, 13, size)

	/* As with bins, we label the large extents table. */
	header_size.width -= 6;
	emitter_table_printf(emitter, "large:");
	emitter_table_row(emitter, &header_row);
	emitter_json_array_kv_begin(emitter, "lextents");

	size_t stats_arenas_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(stats_arenas_mib, 0, "stats.arenas");
	stats_arenas_mib[2] = i;
	CTL_LEAF_PREPARE(stats_arenas_mib, 3, "lextents");

	size_t arenas_lextent_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(arenas_lextent_mib, 0, "arenas.lextent");

	size_t prof_stats_mib[CTL_MAX_DEPTH];
	if (prof_stats_on) {
		CTL_LEAF_PREPARE(prof_stats_mib, 0, "prof.stats.lextents");
	}

	for (j = 0, in_gap = false; j < nlextents; j++) {
		uint64_t nmalloc, ndalloc, nrequests;
		size_t lextent_size, curlextents;
		prof_stats_t prof_live;
		prof_stats_t prof_accum;

		stats_arenas_mib[4] = j;
		arenas_lextent_mib[2] = j;

		CTL_LEAF(stats_arenas_mib, 5, "nmalloc", &nmalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "ndalloc", &ndalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nrequests", &nrequests,
		    uint64_t);

		in_gap_prev = in_gap;
		in_gap = (nrequests == 0);

		if (in_gap_prev && !in_gap) {
			emitter_table_printf(emitter,
			    "                     ---\n");
		}

		CTL_LEAF(arenas_lextent_mib, 3, "size", &lextent_size, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "curlextents", &curlextents,
		    size_t);

		if (prof_stats_on) {
			prof_stats_mib[3] = j;
			CTL_LEAF(prof_stats_mib, 4, "live", &prof_live,
			    prof_stats_t);
			CTL_LEAF(prof_stats_mib, 4, "accum", &prof_accum,
			    prof_stats_t);
		}

		emitter_json_object_begin(emitter);
		if (prof_stats_on) {
			emitter_json_kv(emitter, "prof_live_requested",
			    emitter_type_uint64, &prof_live.req_sum);
			emitter_json_kv(emitter, "prof_live_count",
			    emitter_type_uint64, &prof_live.count);
			emitter_json_kv(emitter, "prof_accum_requested",
			    emitter_type_uint64, &prof_accum.req_sum);
			emitter_json_kv(emitter, "prof_accum_count",
			    emitter_type_uint64, &prof_accum.count);
		}
		emitter_json_kv(emitter, "curlextents", emitter_type_size,
		    &curlextents);
		emitter_json_object_end(emitter);

		col_size.size_val = lextent_size;
		col_ind.unsigned_val = nbins + j;
		col_allocated.size_val = curlextents * lextent_size;
		col_nmalloc.uint64_val = nmalloc;
		col_nmalloc_ps.uint64_val = rate_per_second(nmalloc, uptime);
		col_ndalloc.uint64_val = ndalloc;
		col_ndalloc_ps.uint64_val = rate_per_second(ndalloc, uptime);
		col_nrequests.uint64_val = nrequests;
		col_nrequests_ps.uint64_val = rate_per_second(nrequests, uptime);
		if (prof_stats_on) {
			col_prof_live_requested.uint64_val = prof_live.req_sum;
			col_prof_live_count.uint64_val = prof_live.count;
			col_prof_accum_requested.uint64_val =
			    prof_accum.req_sum;
			col_prof_accum_count.uint64_val = prof_accum.count;
		}
		col_curlextents.size_val = curlextents;

		if (!in_gap) {
			emitter_table_row(emitter, &row);
		}
	}
	emitter_json_array_end(emitter); /* Close "lextents". */
	if (in_gap) {
		emitter_table_printf(emitter, "                     ---\n");
	}
}